

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void deqp::gls::ShaderExecUtil::BufferIoExecutor::computeVarLayout
               (vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                *symbols,
               vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
               *layout)

{
  pointer pVVar1;
  int iVar2;
  int iVar3;
  DataType DVar4;
  pointer pSVar5;
  pointer pVVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  
  std::
  vector<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
  ::resize(layout,((long)(symbols->
                         super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(symbols->
                         super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  pSVar5 = (symbols->
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((symbols->
      super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
      )._M_impl.super__Vector_impl_data._M_finish == pSVar5) {
    uVar10 = 0;
    iVar13 = -1;
  }
  else {
    uVar10 = 0;
    lVar9 = 8;
    lVar12 = 0x28;
    iVar13 = 0;
    uVar8 = 0;
    do {
      DVar4 = *(DataType *)((long)&(pSVar5->name)._M_dataplus._M_p + lVar12);
      pVVar6 = (layout->
               super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((((ulong)DVar4 < 0x23) && ((0x7f803c01eU >> ((ulong)DVar4 & 0x3f) & 1) != 0)) ||
         (DVar4 - TYPE_BOOL < 4)) {
        iVar2 = glu::getDataTypeScalarSize(DVar4);
        uVar11 = 0;
        if (iVar2 - 1U < 4) {
          uVar11 = *(uint *)(&DAT_01cf3540 + (ulong)(iVar2 - 1U) * 4);
        }
        iVar2 = glu::getDataTypeScalarSize(DVar4);
        uVar7 = -uVar11 & (iVar13 + uVar11) - 1;
        if (uVar11 < uVar10) {
          uVar11 = uVar10;
        }
        *(uint *)((long)pVVar6 + lVar9 + -8) = uVar7;
        *(undefined4 *)((long)&pVVar6->offset + lVar9) = 0;
        iVar13 = uVar7 + iVar2 * 4;
        uVar10 = uVar11;
      }
      else if (DVar4 - TYPE_FLOAT_MAT2 < 9 || DVar4 - TYPE_DOUBLE_MAT2 < 9) {
        iVar2 = glu::getDataTypeMatrixNumColumns(DVar4);
        iVar3 = glu::getDataTypeMatrixNumRows(DVar4);
        DVar4 = glu::getDataTypeFloatVec(iVar3);
        iVar3 = glu::getDataTypeScalarSize(DVar4);
        uVar11 = 0;
        if (iVar3 - 1U < 4) {
          uVar11 = *(uint *)(&DAT_01cf3540 + (ulong)(iVar3 - 1U) * 4);
        }
        uVar7 = -uVar11 & (iVar13 + uVar11) - 1;
        if (uVar10 <= uVar11) {
          uVar10 = uVar11;
        }
        *(uint *)((long)pVVar6 + lVar9 + -8) = uVar7;
        *(uint *)((long)&pVVar6->offset + lVar9) = uVar11;
        iVar13 = iVar2 * uVar11 + uVar7;
      }
      uVar8 = uVar8 + 1;
      pSVar5 = (symbols->
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0xc;
      lVar12 = lVar12 + 0x38;
    } while (uVar8 < (ulong)(((long)(symbols->
                                    super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 3)
                            * 0x6db6db6db6db6db7));
    iVar13 = iVar13 + -1;
  }
  pVVar6 = (layout->
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (layout->
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar6 != pVVar1) {
    do {
      pVVar6->stride = -uVar10 & iVar13 + uVar10;
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != pVVar1);
  }
  return;
}

Assistant:

void BufferIoExecutor::computeVarLayout (const std::vector<Symbol>& symbols, std::vector<VarLayout>* layout)
{
	deUint32	maxAlignment	= 0;
	deUint32	curOffset		= 0;

	DE_ASSERT(layout->empty());
	layout->resize(symbols.size());

	for (size_t varNdx = 0; varNdx < symbols.size(); varNdx++)
	{
		const Symbol&		symbol		= symbols[varNdx];
		const glu::DataType	basicType	= symbol.varType.getBasicType();
		VarLayout&			layoutEntry	= (*layout)[varNdx];

		if (glu::isDataTypeScalarOrVector(basicType))
		{
			const deUint32	alignment	= getVecStd430ByteAlignment(basicType);
			const deUint32	size		= (deUint32)glu::getDataTypeScalarSize(basicType)*(int)sizeof(deUint32);

			curOffset		= (deUint32)deAlign32((int)curOffset, (int)alignment);
			maxAlignment	= de::max(maxAlignment, alignment);

			layoutEntry.offset			= curOffset;
			layoutEntry.matrixStride	= 0;

			curOffset += size;
		}
		else if (glu::isDataTypeMatrix(basicType))
		{
			const int				numVecs			= glu::getDataTypeMatrixNumColumns(basicType);
			const glu::DataType		vecType			= glu::getDataTypeFloatVec(glu::getDataTypeMatrixNumRows(basicType));
			const deUint32			vecAlignment	= getVecStd430ByteAlignment(vecType);

			curOffset		= (deUint32)deAlign32((int)curOffset, (int)vecAlignment);
			maxAlignment	= de::max(maxAlignment, vecAlignment);

			layoutEntry.offset			= curOffset;
			layoutEntry.matrixStride	= vecAlignment;

			curOffset += vecAlignment*numVecs;
		}
		else
			DE_ASSERT(false);
	}

	{
		const deUint32	totalSize	= (deUint32)deAlign32(curOffset, maxAlignment);

		for (vector<VarLayout>::iterator varIter = layout->begin(); varIter != layout->end(); ++varIter)
			varIter->stride = totalSize;
	}
}